

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O3

vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
* __thiscall
HBF::heuristic_basic
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<double,_std::allocator<double>_> *start,
          vector<int,_std::allocator<int>_> *goal)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer piVar4;
  pointer piVar5;
  long lVar6;
  double *pdVar7;
  int *piVar8;
  pointer pvVar9;
  pointer pvVar10;
  long lVar11;
  pointer pvVar12;
  ulong uVar13;
  pointer pvVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  initializer_list<int> __l;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  next_state;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  opened;
  vector<int,_std::allocator<int>_> next;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  closed;
  allocator_type local_c9;
  int local_c8;
  int local_c4;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_c0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_b8;
  vector<int,_std::allocator<int>_> local_a0;
  int local_84;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_80;
  vector<int,_std::allocator<int>_> local_68;
  vector<int,_std::allocator<int>_> *local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_50 = goal;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,grid);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,grid);
  pvVar12 = (__return_storage_ptr__->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(__return_storage_ptr__->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12;
  if (lVar11 != 0) {
    lVar11 = (lVar11 >> 3) * -0x5555555555555555;
    piVar4 = (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = *(pointer *)
              ((long)&(pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar15 = (long)piVar5 - (long)piVar4 >> 2;
    lVar16 = 0;
    do {
      if (piVar5 != piVar4) {
        lVar6 = *(long *)&pvVar12[lVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        lVar18 = 0;
        do {
          if (*(int *)(lVar6 + lVar18 * 4) == 1) {
            *(undefined4 *)(lVar6 + lVar18 * 4) = 999;
          }
          lVar18 = lVar18 + 1;
        } while (lVar15 + (ulong)(lVar15 == 0) != lVar18);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar11 + (ulong)(lVar11 == 0));
  }
  pdVar7 = (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_b8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44((int)pdVar7[1],(int)*pdVar7);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_b8;
  local_c0 = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__l,(allocator_type *)&local_a0);
  __l_00._M_len = 1;
  __l_00._M_array = &local_68;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_80,__l_00,(allocator_type *)&local_c8);
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pdVar7 = (start->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *(undefined4 *)
   (*(long *)&(local_c0->
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[(int)*pdVar7].
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data +
   (long)(int)pdVar7[1] * 4) = 1;
  if (local_80.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_68,
                 local_80.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::_M_erase(&local_80,
                 (iterator)
                 local_80.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      iVar1 = *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[1];
      piVar8 = (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((iVar1 == *piVar8) && (iVar2 == piVar8[1])) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
        break;
      }
      local_b8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_c8 = iVar1 + -1;
      __l_01._M_len = 2;
      __l_01._M_array = &local_c8;
      local_c4 = iVar2;
      std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l_01,&local_c9);
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&local_b8,&local_a0);
      if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_c4 = iVar2 + 1;
      __l_02._M_len = 2;
      __l_02._M_array = &local_c8;
      local_c8 = iVar1;
      std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l_02,&local_c9);
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&local_b8,&local_a0);
      if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_c8 = iVar1 + 1;
      __l_03._M_len = 2;
      __l_03._M_array = &local_c8;
      local_c4 = iVar2;
      std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l_03,&local_c9);
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&local_b8,&local_a0);
      if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_c4 = iVar2 + -1;
      __l_04._M_len = 2;
      __l_04._M_array = &local_c8;
      local_c8 = iVar1;
      std::vector<int,_std::allocator<int>_>::vector(&local_a0,__l_04,&local_c9);
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&local_b8,&local_a0);
      if (local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b8.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_b8.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar12 = (local_c0->
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        local_84 = *(int *)(*(long *)&pvVar12[iVar1].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data + (long)iVar2 * 4) + 1;
        lVar11 = 0;
        uVar19 = 0;
        pvVar10 = local_b8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar14 = local_b8.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          piVar8 = *(int **)((long)&(pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_start + lVar11);
          uVar13 = (ulong)*piVar8;
          if ((((-1 < (long)uVar13) &&
               (pvVar9 = (grid->
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
               uVar17 = ((long)(grid->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) *
                        -0x5555555555555555, uVar13 <= uVar17 && uVar17 - uVar13 != 0)) &&
              (uVar3 = piVar8[1], uVar17 = (ulong)uVar3, -1 < (int)uVar3)) &&
             ((uVar17 < (ulong)((long)*(pointer *)
                                       ((long)&(pvVar9->
                                               super__Vector_base<int,_std::allocator<int>_>).
                                               _M_impl.super__Vector_impl_data + 8) -
                                *(long *)&(pvVar9->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data >> 2) &&
              (local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar17] == 0 &&
               *(int *)(*(long *)&pvVar12[uVar13].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + uVar17 * 4) == 0)))) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back(&local_80,
                        (value_type *)
                        ((long)&(pvVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar11));
            pvVar12 = (local_c0->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(int *)(*(long *)&pvVar12[uVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl
                               .super__Vector_impl_data + uVar17 * 4) = local_84;
            local_48.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar13].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [uVar17] = 1;
            pvVar10 = local_b8.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pvVar14 = local_b8.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar19 = uVar19 + 1;
          uVar13 = ((long)pvVar10 - (long)pvVar14 >> 3) * -0x5555555555555555;
          lVar11 = lVar11 + 0x18;
        } while (uVar19 <= uVar13 && uVar13 - uVar19 != 0);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_b8);
      if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (local_80.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             local_80.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pvVar12 = (local_c0->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(local_c0->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12;
  if (lVar11 != 0) {
    lVar11 = (lVar11 >> 3) * -0x5555555555555555;
    piVar4 = (pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = *(pointer *)
              ((long)&(pvVar12->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar15 = (long)piVar5 - (long)piVar4 >> 2;
    lVar16 = 0;
    do {
      if (piVar5 != piVar4) {
        lVar6 = *(long *)&pvVar12[lVar16].super__Vector_base<int,_std::allocator<int>_>._M_impl;
        lVar18 = 0;
        do {
          if (*(int *)(lVar6 + lVar18 * 4) == 0) {
            *(undefined4 *)(lVar6 + lVar18 * 4) = 999;
          }
          lVar18 = lVar18 + 1;
        } while (lVar15 + (ulong)(lVar15 == 0) != lVar18);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar11 + (ulong)(lVar11 == 0));
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_48);
  return local_c0;
}

Assistant:

vector<vector<int> > HBF::heuristic_basic(vector<vector<int> > grid, vector<double> start, vector<int> goal){
    /*
    Create the heuristic function for A star searches on a grid, given start position and goal position.
    */

    vector<vector<int> > heuristic = grid;
    vector<vector<int> > closed = grid;

    // give obstacles a very large value
    for (int i = 0; i < heuristic.size(); i ++){
        for (int j = 0; j < heuristic[0].size(); j ++){
            if (heuristic[i][j] == 1){
                heuristic[i][j] = 999;
            }
        }
    }

    vector<vector<int>> opened = {{int(start[0]),int(start[1])}};

    heuristic[int(start[0])][int(start[1])] = 1;

    while (!opened.empty() ) {

        vector<int> next = opened[0]; //grab first element
        opened.erase(opened.begin()); //pop first element

        int x = next[0];
        int y = next[1];

        if (x == goal[0] && y == goal[1]) {
            break;
        }

        vector<vector<int>> next_state;
        next_state.push_back({x-1,y});
        next_state.push_back({x,y+1});
        next_state.push_back({x+1,y});
        next_state.push_back({x,y-1});

        int g = heuristic[x][y];

        for (int i = 0; i < next_state.size(); i++) {

            int x2 = next_state[i][0];
            int y2 = next_state[i][1];
            int temp = 0;

            if ((x2 < 0 || x2 >= grid.size()) || (y2 < 0 || y2 >= grid[0].size())) {
                //invalid cell
                continue;
            }

            if (heuristic[idx(x2)][idx(y2)] == 0 & closed[x2][y2] == 0) {
                temp += 1;
                opened.push_back(next_state[i]);
                heuristic[idx(x2)][idx(y2)] = g + max(temp, 1);
                closed[x2][y2] = 1;
            }

        }

    }

    // any remaining unreached cell takes on 999
    for (int i = 0; i < heuristic.size(); i ++){
        for (int j = 0; j < heuristic[0].size(); j ++){
            if (heuristic[i][j] == 0){
                heuristic[i][j] = 999;
            }
        }
    }

    return heuristic;

}